

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_keyword_all_write(NGP_HDU *ngph,fitsfile *ffp,int mode)

{
  NGP_TOKEN *pNVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *keyname;
  char *comm;
  long lVar5;
  long lVar6;
  int r;
  int ib;
  long l;
  char buf [200];
  int local_114;
  fitsfile *local_110;
  uint local_108;
  int local_104;
  long local_100;
  char local_f8 [200];
  
  local_114 = 0x16a;
  if (ffp != (fitsfile *)0x0 && ngph != (NGP_HDU *)0x0) {
    local_114 = 0;
    iVar3 = ngph->tokcnt;
    local_110 = ffp;
    local_108 = mode;
    if (0 < iVar3) {
      lVar6 = 0x50;
      lVar5 = 0;
      do {
        pNVar1 = ngph->tok;
        iVar2 = ngp_keyword_is_write((NGP_TOKEN *)(pNVar1->name + lVar6 + -0x54));
        if (((local_108 & 1) == 0) && (iVar2 != 0)) {
          local_114 = 0;
          if ((iVar2 == 0x170) && (pNVar1->name[lVar6 + 0xc] != '\0')) {
            ffmcom(local_110,pNVar1->name + lVar6 + -0x50,pNVar1->name + lVar6 + 0xc,&local_114);
            goto switchD_00173f6d_default;
          }
          goto LAB_00174013;
        }
        local_114 = iVar2;
        switch(((NGP_TOKEN *)(pNVar1->name + lVar6 + -0x54))->type) {
        case 1:
          keyname = pNVar1->name + lVar6 + -4 + -0x4c;
          local_104 = (int)pNVar1->name[lVar6 + -4];
          comm = pNVar1->name + lVar6 + 0xc;
          iVar3 = 0xe;
          pcVar4 = (char *)&local_104;
          goto LAB_00173ffa;
        case 2:
          ffpkls(local_110,pNVar1->name + lVar6 + -4 + -0x4c,*(char **)(pNVar1->name + lVar6 + -4),
                 pNVar1->name + lVar6 + 0xc,&local_114);
          break;
        case 3:
          keyname = pNVar1->name + lVar6 + -4 + -0x4c;
          local_100 = (long)*(int *)(pNVar1->name + lVar6 + -4);
          comm = pNVar1->name + lVar6 + 0xc;
          iVar3 = 0x29;
          pcVar4 = (char *)&local_100;
          goto LAB_00173ffa;
        case 4:
          pcVar4 = pNVar1->name + lVar6 + -4;
          keyname = pNVar1->name + lVar6 + -0x50;
          comm = pNVar1->name + lVar6 + 0xc;
          iVar3 = 0x52;
          goto LAB_00173ffa;
        case 5:
          pcVar4 = pNVar1->name + lVar6 + -4;
          keyname = pNVar1->name + lVar6 + -0x50;
          comm = pNVar1->name + lVar6 + 0xc;
          iVar3 = 0xa3;
LAB_00173ffa:
          ffpky(local_110,iVar3,keyname,pcVar4,comm,&local_114);
          break;
        case 6:
          ffpkyu(local_110,pNVar1->name + lVar6 + -0x50,pNVar1->name + lVar6 + 0xc,&local_114);
          break;
        case 7:
          pcVar4 = pNVar1->name + lVar6 + -0x50;
          iVar3 = strcmp("HISTORY",pcVar4);
          if (iVar3 == 0) {
            ffphis(local_110,pNVar1->name + lVar6 + 0xc,&local_114);
          }
          else {
            iVar3 = strcmp("COMMENT",pcVar4);
            if (iVar3 == 0) {
              ffpcom(local_110,pNVar1->name + lVar6 + 0xc,&local_114);
            }
            else {
              snprintf(local_f8,200,"%-8.8s%s",pcVar4);
              ffprec(local_110,local_f8,&local_114);
            }
          }
        }
switchD_00173f6d_default:
        if (local_114 != 0) {
          return local_114;
        }
        iVar3 = ngph->tokcnt;
LAB_00174013:
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0xb0;
      } while (lVar5 < iVar3);
    }
    ffrdef(local_110,&local_114);
  }
  return local_114;
}

Assistant:

int     ngp_keyword_all_write(NGP_HDU *ngph, fitsfile *ffp, int mode)
 { int		i, r, ib;
   char		buf[200];
   long		l;


   if (NULL == ngph) return(NGP_NUL_PTR);
   if (NULL == ffp) return(NGP_NUL_PTR);
   r = NGP_OK;
   
   for (i=0; i<ngph->tokcnt; i++)
    { r = ngp_keyword_is_write(&(ngph->tok[i]));
      if ((NGP_REALLY_ALL & mode) || (NGP_OK == r))
        { switch (ngph->tok[i].type)
           { case NGP_TTYPE_BOOL:
			ib = ngph->tok[i].value.b;
			fits_write_key(ffp, TLOGICAL, ngph->tok[i].name, &ib, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_STRING:
			fits_write_key_longstr(ffp, ngph->tok[i].name, ngph->tok[i].value.s, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_INT:
			l = ngph->tok[i].value.i;	/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
			fits_write_key(ffp, TLONG, ngph->tok[i].name, &l, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_REAL:
			fits_write_key(ffp, TDOUBLE, ngph->tok[i].name, &(ngph->tok[i].value.d), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_COMPLEX:
			fits_write_key(ffp, TDBLCOMPLEX, ngph->tok[i].name, &(ngph->tok[i].value.c), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_NULL:
			fits_write_key_null(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_RAW:
			if (0 == strcmp("HISTORY", ngph->tok[i].name))
			  { fits_write_history(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			if (0 == strcmp("COMMENT", ngph->tok[i].name))
			  { fits_write_comment(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			snprintf(buf,200, "%-8.8s%s", ngph->tok[i].name, ngph->tok[i].comment);
			fits_write_record(ffp, buf, &r);
                        break;
           }
        }
      else if (NGP_BAD_ARG == r) /* enhancement 10 dec 2003, James Peachey: template comments replace defaults */
        { r = NGP_OK;						/* update comments of special keywords like TFORM */
          if (ngph->tok[i].comment && *ngph->tok[i].comment)	/* do not update with a blank comment */
            { fits_modify_comment(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
            }
        }
      else /* other problem, typically a blank token */
        { r = NGP_OK;						/* skip this token, but continue */
        }
      if (r) return(r);
    }
     
   fits_set_hdustruc(ffp, &r);				/* resync cfitsio */
   return(r);
 }